

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O0

RC __thiscall RM_FileHandle::GetRec(RM_FileHandle *this,RID *rid,RM_Record *rec)

{
  int rec_size;
  bool bVar1;
  RID RStack_78;
  RC rc2;
  bool local_69;
  bool recordExists;
  RM_PageHeader *pageheader;
  char *bitmap;
  undefined1 local_48 [8];
  PF_PageHandle ph;
  PageNum local_30;
  SlotNum slot;
  PageNum page;
  RC rc;
  RM_Record *rec_local;
  RID *rid_local;
  RM_FileHandle *this_local;
  
  _page = rec;
  rec_local = (RM_Record *)rid;
  rid_local = (RID *)this;
  bVar1 = isValidFH(this);
  if (bVar1) {
    slot = 0;
    slot = GetPageNumAndSlot(this,&rec_local->rid,&local_30,(SlotNum *)((long)&ph.pPageData + 4));
    this_local._4_4_ = slot;
    if (slot == 0) {
      PF_PageHandle::PF_PageHandle((PF_PageHandle *)local_48);
      slot = PF_FileHandle::GetThisPage(&this->pfh,local_30,(PF_PageHandle *)local_48);
      this_local._4_4_ = slot;
      if (slot == 0) {
        slot = GetPageDataAndBitmap
                         (this,(PF_PageHandle *)local_48,(char **)&pageheader,
                          (RM_PageHeader **)&stack0xffffffffffffff98);
        if ((slot == 0) &&
           (slot = CheckBitSet(this,(char *)pageheader,(this->header).numRecordsPerPage,
                               ph.pPageData._4_4_,&local_69), slot == 0)) {
          if ((local_69 & 1U) == 0) {
            slot = 0x67;
          }
          else {
            RStack_78 = rec_local->rid;
            rec_size = (this->header).recordSize;
            slot = RM_Record::SetRecord
                             (_page,&stack0xffffffffffffff88,
                              (char *)((long)&pageheader->nextFreePage +
                                      (long)(ph.pPageData._4_4_ * rec_size) +
                                      (long)(this->header).bitmapSize),rec_size);
            RID::~RID(&stack0xffffffffffffff88);
          }
        }
        this_local._4_4_ = PF_FileHandle::UnpinPage(&this->pfh,local_30);
        if (this_local._4_4_ == 0) {
          this_local._4_4_ = slot;
        }
      }
      bitmap._0_4_ = 1;
      PF_PageHandle::~PF_PageHandle((PF_PageHandle *)local_48);
    }
  }
  else {
    this_local._4_4_ = 0x6a;
  }
  return this_local._4_4_;
}

Assistant:

RC RM_FileHandle::GetRec (const RID &rid, RM_Record &rec) const {
  // only proceed if this filehandle is associated with an open file
  if (!isValidFH())
    return (RM_INVALIDFILE);

  // Retrieves page and slot number from RID
  RC rc = 0;
  PageNum page;
  SlotNum slot;
  if((rc = GetPageNumAndSlot(rid, page, slot)))
    return (rc);

  // Retrieves the appropriate page, and its bitmap and pageheader 
  // contents
  PF_PageHandle ph;
  if((rc = pfh.GetThisPage(page, ph))){
    return (rc);
  }
  char *bitmap;
  struct RM_PageHeader *pageheader;
  if((rc = GetPageDataAndBitmap(ph, bitmap, pageheader)))
    goto cleanup_and_exit;

  // Check if there really exists a record here according to the header
  bool recordExists;
  if ((rc = CheckBitSet(bitmap, header.numRecordsPerPage, slot, recordExists)))
    goto cleanup_and_exit;
  if(!recordExists){
    rc = RM_INVALIDRECORD;
    goto cleanup_and_exit;
  }

  // Set the record and return it
  if((rc = rec.SetRecord(rid, bitmap + (header.bitmapSize) + slot*(header.recordSize), 
    header.recordSize)))
    goto cleanup_and_exit;

  // always unpin the page before returning
  cleanup_and_exit:
  RC rc2;
  if((rc2 = pfh.UnpinPage(page)))
    return (rc2);
  return (rc); 
}